

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::CondVar::SignalAll(CondVar *this)

{
  PerThreadSynch *w_00;
  CondVar *pCVar1;
  CondVar *local_a0;
  PerThreadSynch *local_98;
  PerThreadSynch *n;
  PerThreadSynch *w;
  PerThreadSynch *h;
  CondVar *pCStack_78;
  int c;
  intptr_t v;
  CondVar *this_local;
  memory_order local_60;
  int local_5c;
  memory_order __b_1;
  CondVar *local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  undefined1 *local_18;
  CondVar *local_10;
  
  h._4_4_ = 0;
  local_44 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = *(CondVar **)this;
  }
  else if (local_44 == 5) {
    local_50 = *(CondVar **)this;
  }
  else {
    local_50 = *(CondVar **)this;
  }
  pCStack_78 = local_50;
  do {
    if (pCStack_78 == (CondVar *)0x0) {
      return;
    }
    pCVar1 = pCStack_78;
    if (((ulong)pCStack_78 & 1) == 0) {
      local_30 = (ulong)((uint)pCStack_78 & 2);
      local_18 = (undefined1 *)&stack0xffffffffffffff88;
      local_24 = 2;
      local_28 = 0;
      LOCK();
      pCVar1 = *(CondVar **)this;
      local_31 = pCStack_78 == pCVar1;
      if ((bool)local_31) {
        *(ulong *)this = local_30;
        pCVar1 = pCStack_78;
      }
      UNLOCK();
      local_20 = local_30;
      local_10 = this;
      if ((bool)local_31) {
        w = (PerThreadSynch *)((ulong)pCStack_78 & 0xfffffffffffffffc);
        if (w != (PerThreadSynch *)0x0) {
          local_98 = w->next;
          do {
            w_00 = local_98;
            n = local_98;
            local_98 = local_98->next;
            Wakeup(this,w_00);
          } while (n != w);
          local_a0 = this;
          base_internal::AtomicHook<void(*)(char_const*,void_const*)>::operator()
                    ((anonymous_namespace)::cond_var_tracer,(char (*) [17])"SignalAll wakeup",
                     &local_a0);
        }
        if (((ulong)pCStack_78 & 2) != 0) {
          PostSynchEvent(this,0xd);
        }
        return;
      }
    }
    pCStack_78 = pCVar1;
    h._4_4_ = synchronization_internal::MutexDelay(h._4_4_,1);
    local_5c = 0;
    ___b_1 = this;
    local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_5c - 1U < 2) {
      this_local = *(CondVar **)this;
    }
    else if (local_5c == 5) {
      this_local = *(CondVar **)this;
    }
    else {
      this_local = *(CondVar **)this;
    }
    pCStack_78 = this_local;
  } while( true );
}

Assistant:

void CondVar::SignalAll () {
  ABSL_TSAN_MUTEX_PRE_SIGNAL(nullptr, 0);
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed); v != 0;
       v = cv_.load(std::memory_order_relaxed)) {
    // empty the list if spinlock free
    // We do this by simply setting the list to empty using
    // compare and swap.   We then have the entire list in our hands,
    // which cannot be changing since we grabbed it while no one
    // held the lock.
    if ((v & kCvSpin) == 0 &&
        cv_.compare_exchange_strong(v, v & kCvEvent, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch *h = reinterpret_cast<PerThreadSynch *>(v & ~kCvLow);
      if (h != nullptr) {
        PerThreadSynch *w;
        PerThreadSynch *n = h->next;
        do {                          // for every thread, wake it up
          w = n;
          n = n->next;
          CondVar::Wakeup(w);
        } while (w != h);
        cond_var_tracer("SignalAll wakeup", this);
      }
      if ((v & kCvEvent) != 0) {
        PostSynchEvent(this, SYNCH_EV_SIGNALALL);
      }
      ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
      return;
    } else {
      // try again after a delay
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
  ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
}